

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

timer_type * __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::make_exec_list(timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                 *this)

{
  timer_type *ptVar1;
  timer_type *ptVar2;
  timer_type *ptVar3;
  timer_type *ptVar4;
  timer_type *t;
  timer_type *ptVar5;
  pointer pwVar6;
  timer_type **pptVar7;
  
  ptVar4 = (this->m_wheel).
           super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
           ._M_impl.super__Vector_impl_data._M_start[this->m_current_position].m_head;
  ptVar2 = (timer_type *)0x0;
  if (ptVar4 != (timer_type *)0x0) {
    ptVar3 = (timer_type *)0x0;
    do {
      if (ptVar4->m_full_rolls_left == 0) {
        ptVar1 = ptVar4->m_prev;
        if (ptVar1 == (timer_type *)0x0) {
          pwVar6 = (this->m_wheel).
                   super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
                   ._M_impl.super__Vector_impl_data._M_start + ptVar4->m_position;
        }
        else {
          pwVar6 = (pointer)&ptVar1->m_next;
        }
        ptVar5 = ptVar4->m_next;
        pwVar6->m_head = ptVar5;
        if (ptVar5 == (timer_type *)0x0) {
          pptVar7 = &(this->m_wheel).
                     super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
                     ._M_impl.super__Vector_impl_data._M_start[ptVar4->m_position].m_tail;
        }
        else {
          pptVar7 = &ptVar5->m_prev;
        }
        *pptVar7 = ptVar1;
        *(undefined4 *)&(ptVar4->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 2;
        if (ptVar2 == (timer_type *)0x0) {
          ptVar4->m_prev = (timer_type *)0x0;
          ptVar4->m_next = (timer_type *)0x0;
          ptVar2 = ptVar4;
        }
        else {
          ptVar3->m_next = ptVar4;
          ptVar4->m_prev = ptVar3;
          ptVar4->m_next = (timer_type *)0x0;
        }
      }
      else {
        ptVar4->m_full_rolls_left = ptVar4->m_full_rolls_left - 1;
        ptVar5 = ptVar4->m_next;
        ptVar4 = ptVar3;
      }
      ptVar3 = ptVar4;
      ptVar4 = ptVar5;
    } while (ptVar5 != (timer_type *)0x0);
  }
  return ptVar2;
}

Assistant:

timer_type *
	make_exec_list()
	{
		timer_type * head = nullptr;
		timer_type * tail = nullptr;

		timer_type * timer = m_wheel[ m_current_position ].m_head;
		while( timer )
		{
			if( timer->m_full_rolls_left )
			{
				timer->m_full_rolls_left -= 1;
				timer = timer->m_next;
			}
			else
			{
				timer_type * t = timer;
				timer = timer->m_next;

				remove_timer_from_wheel( t );
				t->m_status = timer_status::wait_for_execution;

				if( head )
				{
					tail->m_next = t;
					t->m_prev = tail;
					t->m_next = nullptr;
					tail = t;
				}
				else
				{
					head = tail = t;
					t->m_prev = t->m_next = nullptr;
				}
			}
		}

		return head;
	}